

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int nodeInsertCell(Rtree *pRtree,RtreeNode *pNode,RtreeCell *pCell)

{
  ushort uVar1;
  uint uVar2;
  
  uVar2 = (pRtree->iNodeSize + -4) / (int)(uint)pRtree->nBytesPerCell;
  uVar1 = *(ushort *)(pNode->zData + 2) << 8 | *(ushort *)(pNode->zData + 2) >> 8;
  if ((int)(uint)uVar1 < (int)uVar2) {
    nodeOverwriteCell(pRtree,pNode,pCell,(uint)uVar1);
    *(ushort *)(pNode->zData + 2) = (uVar1 + 1) * 0x100 | (ushort)(uVar1 + 1) >> 8;
    pNode->isDirty = 1;
  }
  return (int)(uVar1 == uVar2);
}

Assistant:

static int nodeInsertCell(
  Rtree *pRtree,                /* The overall R-Tree */
  RtreeNode *pNode,             /* Write new cell into this node */
  RtreeCell *pCell              /* The cell to be inserted */
){
  int nCell;                    /* Current number of cells in pNode */
  int nMaxCell;                 /* Maximum number of cells for pNode */

  nMaxCell = (pRtree->iNodeSize-4)/pRtree->nBytesPerCell;
  nCell = NCELL(pNode);

  assert( nCell<=nMaxCell );
  if( nCell<nMaxCell ){
    nodeOverwriteCell(pRtree, pNode, pCell, nCell);
    writeInt16(&pNode->zData[2], nCell+1);
    pNode->isDirty = 1;
  }

  return (nCell==nMaxCell);
}